

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_unset(kvtree *hash,char *key)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem *in_RAX;
  kvtree_elem *pkVar2;
  
  if ((hash != (kvtree *)0x0) && (pkVar2 = kvtree_elem_get(hash,key), pkVar2 != (kvtree_elem *)0x0))
  {
    pkVar1 = (pkVar2->pointers).le_next;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = (pkVar2->pointers).le_prev;
    }
    *(pkVar2->pointers).le_prev = pkVar1;
    if (pkVar2 != (kvtree_elem *)0x0) {
      kvtree_elem_delete(in_RAX);
    }
  }
  return 0;
}

Assistant:

int kvtree_unset(kvtree* hash, const char* key)
{
  if (hash == NULL) {
    return KVTREE_SUCCESS;
  }

  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem != NULL) {
    kvtree_elem_delete(elem);
  }
  return KVTREE_SUCCESS;
}